

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToUniUcs2Big::map
          (CCharmapToUniUcs2Big *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  size_t sVar1;
  ulong uVar2;
  wchar_t ch;
  size_t sVar3;
  
  if (inlen < 2) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      ch = (wchar_t)CONCAT11(*inp,((byte *)inp)[1]);
      uVar2 = 3 - (ulong)((byte)*inp < 8);
      if ((uint)ch < 0x80) {
        uVar2 = 1;
      }
      if (*outlen < uVar2) {
        sVar1 = 0;
      }
      else {
        sVar1 = utf8_ptr::s_putch(*outp,ch);
        *outp = *outp + sVar1;
        sVar1 = *outlen - uVar2;
      }
      sVar3 = sVar3 + uVar2;
      *outlen = sVar1;
      inlen = inlen - 2;
      inp = (char *)((byte *)inp + 2);
    } while (1 < inlen);
  }
  return sVar3;
}

Assistant:

size_t CCharmapToUniUcs2Big::map(char **outp, size_t *outlen,
                                 const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte pair) in the input string */
    for ( ; inlen > 1 ; inlen -= 2, inp += 2)
    {
        wchar_t uni;
        size_t csiz;

        /* 
         *   read the big-endian two-byte value - no mapping is required,
         *   since UCS-2 uses the same code point assignments as UTF-8 
         */
        uni = (((wchar_t)(unsigned char)*inp) << 8)
              + ((wchar_t)(unsigned char)*(inp + 1));

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);

            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}